

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O0

psa_status_t psa_open_key(psa_key_file_id_t id,psa_key_handle_t *handle)

{
  psa_key_slot_t *local_28;
  psa_key_slot_t *slot;
  psa_key_handle_t *ppStack_18;
  psa_status_t status;
  psa_key_handle_t *handle_local;
  psa_key_file_id_t id_local;
  
  *handle = 0;
  ppStack_18 = handle;
  handle_local._0_4_ = id;
  slot._4_4_ = psa_validate_persistent_key_parameters(1,id,(psa_se_drv_table_entry_t **)0x0,0);
  handle_local._4_4_ = slot._4_4_;
  if ((slot._4_4_ == 0) &&
     (slot._4_4_ = psa_get_empty_key_slot(ppStack_18,&local_28), handle_local._4_4_ = slot._4_4_,
     slot._4_4_ == 0)) {
    (local_28->attr).lifetime = 1;
    (local_28->attr).id = (psa_key_file_id_t)handle_local;
    slot._4_4_ = psa_load_persistent_key_into_slot(local_28);
    if (slot._4_4_ != 0) {
      psa_wipe_key_slot(local_28);
      *ppStack_18 = 0;
    }
    handle_local._4_4_ = slot._4_4_;
  }
  return handle_local._4_4_;
}

Assistant:

psa_status_t psa_open_key( psa_key_file_id_t id, psa_key_handle_t *handle )
{
#if defined(MBEDTLS_PSA_CRYPTO_STORAGE_C)
    psa_status_t status;
    psa_key_slot_t *slot;

    *handle = 0;

    status = psa_validate_persistent_key_parameters(
        PSA_KEY_LIFETIME_PERSISTENT, id, NULL, 0 );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_get_empty_key_slot( handle, &slot );
    if( status != PSA_SUCCESS )
        return( status );

    slot->attr.lifetime = PSA_KEY_LIFETIME_PERSISTENT;
    slot->attr.id = id;

    status = psa_load_persistent_key_into_slot( slot );
    if( status != PSA_SUCCESS )
    {
        psa_wipe_key_slot( slot );
        *handle = 0;
    }
    return( status );

#else /* defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */
    (void) id;
    *handle = 0;
    return( PSA_ERROR_NOT_SUPPORTED );
#endif /* !defined(MBEDTLS_PSA_CRYPTO_STORAGE_C) */
}